

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElementType::~IfcDistributionControlElementType
          (IfcDistributionControlElementType *this)

{
  IfcTypeObject *this_00;
  long *plVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionElementType).super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeObject *)
            (&(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
              super_IfcTypeObject.field_0x0 + lVar2);
  plVar1 = (long *)(&(this->super_IfcDistributionElementType).super_IfcElementType.field_0x168 +
                   lVar2);
  plVar1[-0x2d] = 0x8f5008;
  plVar1[7] = 0x8f50d0;
  plVar1[-0x1c] = 0x8f5030;
  plVar1[-0x1a] = 0x8f5058;
  plVar1[-0xf] = 0x8f5080;
  plVar1[-4] = 0x8f50a8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  *(undefined8 *)this_00 = 0x8f50f8;
  this_00[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8f5198;
  *(undefined8 *)&this_00->field_0x88 = 0x8f5120;
  (this_00->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x8f5148;
  *(undefined8 *)&this_00->field_0xf0 = 0x8f5170;
  if (*(undefined1 **)&this_00[1].field_0x18 != &this_00[1].field_0x28) {
    operator_delete(*(undefined1 **)&this_00[1].field_0x18,*(long *)&this_00[1].field_0x28 + 1);
  }
  pvVar3 = *(void **)&this_00->field_0x100;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this_00[1].field_0x8 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject(this_00,&PTR_construction_vtable_24__008f4d70);
  return;
}

Assistant:

IfcDistributionControlElementType() : Object("IfcDistributionControlElementType") {}